

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTIMUBMX055.cpp
# Opt level: O2

bool __thiscall RTIMUBMX055::setGyroFSR(RTIMUBMX055 *this)

{
  uint uVar1;
  RTIMUSettings *this_00;
  bool bVar2;
  
  this_00 = (this->super_RTIMU).m_settings;
  uVar1 = this_00->m_BMX055GyroFsr;
  if ((ulong)uVar1 < 5) {
    this->m_gyroScale = *(RTFLOAT *)(&DAT_001216e8 + (ulong)uVar1 * 4);
    bVar2 = RTIMUHal::HALWrite(&this_00->super_RTIMUHal,this->m_gyroSlaveAddr,'\x0f',(uchar)uVar1,
                               "Failed to set BMX055 gyro rate");
    return bVar2;
  }
  fprintf(_stderr,"Illegal BMX055 gyro FSR code %d\n");
  return false;
}

Assistant:

bool RTIMUBMX055::setGyroFSR()
{
    switch(m_settings->m_BMX055GyroFsr) {
    case BMX055_GYRO_FSR_2000:
        m_gyroScale = 0.061 * RTMATH_DEGREE_TO_RAD;
        break;

    case BMX055_GYRO_FSR_1000:
        m_gyroScale = 0.0305 * RTMATH_DEGREE_TO_RAD;
        break;

    case BMX055_GYRO_FSR_500:
        m_gyroScale = 0.0153 * RTMATH_DEGREE_TO_RAD;
        break;

    case BMX055_GYRO_FSR_250:
        m_gyroScale = 0.0076 * RTMATH_DEGREE_TO_RAD;
        break;

    case BMX055_GYRO_FSR_125:
        m_gyroScale = 0.0038 * RTMATH_DEGREE_TO_RAD;
        break;

    default:
        HAL_ERROR1("Illegal BMX055 gyro FSR code %d\n", m_settings->m_BMX055GyroFsr);
        return false;

    }
    return (m_settings->HALWrite(m_gyroSlaveAddr, BMX055_GYRO_RANGE, m_settings->m_BMX055GyroFsr, "Failed to set BMX055 gyro rate"));
}